

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

int Ssc_GiaSimulatePattern_rec(Ssc_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  int Res1;
  int Res0;
  Gia_Obj_t *pObj_local;
  Ssc_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p->pAig,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p->pAig,pObj);
    if (pObj->Value == 0xffffffff) {
      pGVar6 = Gia_ObjFanin0(pObj);
      uVar2 = Ssc_GiaSimulatePattern_rec(p,pGVar6);
      pGVar6 = Gia_ObjFanin1(pObj);
      uVar3 = Ssc_GiaSimulatePattern_rec(p,pGVar6);
      uVar4 = Gia_ObjFaninC0(pObj);
      uVar5 = Gia_ObjFaninC1(pObj);
      *(ulong *)pObj =
           *(ulong *)pObj & 0xffffffffbfffffff |
           ((ulong)((uVar2 ^ uVar4) & (uVar3 ^ uVar5)) & 1) << 0x1e;
    }
    else {
      iVar1 = Abc_Lit2Var(pObj->Value);
      uVar2 = Ssc_GiaSimulatePatternFraig_rec(p,iVar1);
      uVar3 = Abc_LitIsCompl(pObj->Value);
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | ((ulong)(uVar2 ^ uVar3) & 1) << 0x1e;
    }
    uVar2 = (uint)(*(ulong *)pObj >> 0x1e);
  }
  else {
    uVar2 = (uint)(*(ulong *)pObj >> 0x1e);
  }
  p_local._4_4_ = uVar2 & 1;
  return p_local._4_4_;
}

Assistant:

int Ssc_GiaSimulatePattern_rec( Ssc_Man_t * p, Gia_Obj_t * pObj )
{
    int Res0, Res1;
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( ~pObj->Value )  // mapping into FRAIG exists - simulate FRAIG
    { 
        Res0 = Ssc_GiaSimulatePatternFraig_rec( p, Abc_Lit2Var(pObj->Value) );
        pObj->fMark0 = Res0 ^ Abc_LitIsCompl(pObj->Value);
    }
    else // mapping into FRAIG does not exist - simulate AIG
    {
        Res0 = Ssc_GiaSimulatePattern_rec( p, Gia_ObjFanin0(pObj) );
        Res1 = Ssc_GiaSimulatePattern_rec( p, Gia_ObjFanin1(pObj) );
        pObj->fMark0 = (Res0 ^ Gia_ObjFaninC0(pObj)) & (Res1 ^ Gia_ObjFaninC1(pObj));
    }
    return pObj->fMark0;
}